

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

char * __thiscall
google::protobuf::DescriptorProto_ReservedRange::_InternalParse
          (DescriptorProto_ReservedRange *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  byte bVar2;
  byte *pbVar3;
  uint32 res;
  uint tag;
  uint uVar4;
  uint uVar5;
  pair<const_char_*,_unsigned_int> pVar6;
  pair<const_char_*,_unsigned_long> pVar7;
  pair<const_char_*,_bool> pVar8;
  
  uVar4 = 0;
LAB_0016bb86:
  do {
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
      if ((long)ptr - (long)(ctx->super_EpsCopyInputStream).buffer_end_ ==
          (long)(ctx->super_EpsCopyInputStream).limit_) goto LAB_0016bcc0;
      pVar8 = internal::EpsCopyInputStream::DoneFallback
                        (&ctx->super_EpsCopyInputStream,ptr,ctx->group_depth_);
      ptr = pVar8.first;
      if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
      goto LAB_0016bcc0;
    }
    bVar1 = *ptr;
    pVar6.second._0_1_ = bVar1;
    pVar6.first = (char *)((byte *)ptr + 1);
    pVar6._9_7_ = 0;
    if ((char)bVar1 < '\0') {
      bVar2 = ((byte *)ptr)[1];
      res = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        pVar6 = internal::ReadTagFallback(ptr,res);
        if (pVar6.first == (char *)0x0) goto LAB_0016bcce;
      }
      else {
        pVar6.second = res;
        pVar6.first = (char *)((byte *)ptr + 2);
        pVar6._12_4_ = 0;
      }
    }
    ptr = pVar6.first;
    tag = pVar6.second;
    uVar5 = (uint)(pVar6._8_8_ >> 3) & 0x1fffffff;
    if (uVar5 == 2) {
      if ((char)pVar6.second == '\x10') {
        uVar4 = uVar4 | 2;
        bVar1 = *ptr;
        uVar5 = (uint)bVar1;
        pbVar3 = (byte *)ptr + 1;
        if ((char)bVar1 < '\0') {
          bVar2 = ((byte *)ptr)[1];
          uVar5 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
          if ((char)bVar2 < '\0') {
            pVar7 = internal::VarintParseSlow64(ptr,uVar5);
            ptr = pVar7.first;
            this->end_ = (int32)pVar7.second;
            goto LAB_0016bc5f;
          }
          pbVar3 = (byte *)ptr + 2;
        }
        ptr = (char *)pbVar3;
        this->end_ = uVar5;
        goto LAB_0016bb86;
      }
LAB_0016bc3e:
      if ((tag == 0) || ((tag & 7) == 4)) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = tag - 1;
        goto LAB_0016bcc0;
      }
      ptr = internal::UnknownFieldParse(tag,&this->_internal_metadata_,ptr,ctx);
    }
    else {
      if ((uVar5 != 1) || ((char)pVar6.second != '\b')) goto LAB_0016bc3e;
      uVar4 = uVar4 | 1;
      bVar1 = *ptr;
      uVar5 = (uint)bVar1;
      pbVar3 = (byte *)ptr + 1;
      if (-1 < (char)bVar1) {
LAB_0016bc02:
        this->start_ = uVar5;
        ptr = (char *)pbVar3;
        goto LAB_0016bb86;
      }
      uVar5 = ((uint)bVar1 + (uint)*pbVar3 * 0x80) - 0x80;
      if (-1 < (char)*pbVar3) {
        pbVar3 = (byte *)ptr + 2;
        goto LAB_0016bc02;
      }
      pVar7 = internal::VarintParseSlow64(ptr,uVar5);
      ptr = pVar7.first;
      this->start_ = (int32)pVar7.second;
    }
LAB_0016bc5f:
    if ((byte *)ptr == (byte *)0x0) {
LAB_0016bcce:
      ptr = (char *)0x0;
LAB_0016bcc0:
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar4;
      return ptr;
    }
  } while( true );
}

Assistant:

const char* DescriptorProto_ReservedRange::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional int32 start = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 8)) {
          _Internal::set_has_start(&has_bits);
          start_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional int32 end = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 16)) {
          _Internal::set_has_end(&has_bits);
          end_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}